

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ArrayOrRandomizeMethodExpressionSyntax::setChild
          (ArrayOrRandomizeMethodExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00afa078 + *(int *)(&DAT_00afa078 + in_RSI * 4)))();
  return;
}

Assistant:

void ArrayOrRandomizeMethodExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: method = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: with = child.token(); return;
        case 2: args = child.node() ? &child.node()->as<ParenExpressionListSyntax>() : nullptr; return;
        case 3: constraints = child.node() ? &child.node()->as<ConstraintBlockSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}